

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode req_assign_url_authority(httpreq *req,CURLU *url)

{
  curl_strdup_callback p_Var1;
  CURLUcode CVar2;
  char *pcVar3;
  CURLcode local_60;
  CURLcode result;
  CURLUcode uc;
  dynbuf buf;
  char *port;
  char *host;
  char *pass;
  char *user;
  CURLU *url_local;
  httpreq *req_local;
  
  local_60 = CURLE_URL_MALFORMAT;
  buf.toobig = 0;
  port = (char *)0x0;
  host = (char *)0x0;
  pass = (char *)0x0;
  user = (char *)url;
  url_local = (CURLU *)req;
  Curl_dyn_init((dynbuf *)&result,0x100000);
  CVar2 = curl_url_get((CURLU *)user,CURLUPART_HOST,&port,0);
  if ((CVar2 == CURLUE_OK) || (CVar2 == CURLUE_NO_HOST)) {
    if (port == (char *)0x0) {
      url_local->host = (char *)0x0;
      local_60 = CURLE_OK;
    }
    else {
      CVar2 = curl_url_get((CURLU *)user,CURLUPART_PORT,(char **)&buf.toobig,2);
      if (((((CVar2 == CURLUE_OK) || (CVar2 == CURLUE_NO_PORT)) &&
           ((CVar2 = curl_url_get((CURLU *)user,CURLUPART_USER,&pass,0), CVar2 == CURLUE_OK ||
            (CVar2 == CURLUE_NO_USER)))) &&
          ((((pass == (char *)0x0 ||
             (CVar2 = curl_url_get((CURLU *)user,CURLUPART_PASSWORD,&host,0), CVar2 == CURLUE_OK))
            || (CVar2 == CURLUE_NO_PASSWORD)) &&
           ((pass == (char *)0x0 ||
            (((local_60 = Curl_dyn_add((dynbuf *)&result,pass), local_60 == CURLE_OK &&
              ((host == (char *)0x0 ||
               (local_60 = Curl_dyn_addf((dynbuf *)&result,":%s",host), local_60 == CURLE_OK)))) &&
             (local_60 = Curl_dyn_add((dynbuf *)&result,"@"), local_60 == CURLE_OK)))))))) &&
         ((local_60 = Curl_dyn_add((dynbuf *)&result,port), local_60 == CURLE_OK &&
          ((buf.toobig == 0 ||
           (local_60 = Curl_dyn_addf((dynbuf *)&result,":%s",buf.toobig), local_60 == CURLE_OK))))))
      {
        p_Var1 = Curl_cstrdup;
        pcVar3 = Curl_dyn_ptr((dynbuf *)&result);
        pcVar3 = (*p_Var1)(pcVar3);
        url_local->host = pcVar3;
        if (url_local->host != (char *)0x0) {
          local_60 = CURLE_OK;
        }
      }
    }
  }
  (*Curl_cfree)(pass);
  (*Curl_cfree)(host);
  (*Curl_cfree)(port);
  (*Curl_cfree)((void *)buf.toobig);
  Curl_dyn_free((dynbuf *)&result);
  return local_60;
}

Assistant:

static CURLcode req_assign_url_authority(struct httpreq *req, CURLU *url)
{
  char *user, *pass, *host, *port;
  struct dynbuf buf;
  CURLUcode uc;
  CURLcode result = CURLE_URL_MALFORMAT;

  user = pass = host = port = NULL;
  Curl_dyn_init(&buf, DYN_HTTP_REQUEST);

  uc = curl_url_get(url, CURLUPART_HOST, &host, 0);
  if(uc && uc != CURLUE_NO_HOST)
    goto out;
  if(!host) {
    req->authority = NULL;
    result = CURLE_OK;
    goto out;
  }

  uc = curl_url_get(url, CURLUPART_PORT, &port, CURLU_NO_DEFAULT_PORT);
  if(uc && uc != CURLUE_NO_PORT)
    goto out;
  uc = curl_url_get(url, CURLUPART_USER, &user, 0);
  if(uc && uc != CURLUE_NO_USER)
    goto out;
  if(user) {
    uc = curl_url_get(url, CURLUPART_PASSWORD, &pass, 0);
    if(uc && uc != CURLUE_NO_PASSWORD)
      goto out;
  }

  if(user) {
    result = Curl_dyn_add(&buf, user);
    if(result)
      goto out;
    if(pass) {
      result = Curl_dyn_addf(&buf, ":%s", pass);
      if(result)
        goto out;
    }
    result = Curl_dyn_add(&buf, "@");
    if(result)
      goto out;
  }
  result = Curl_dyn_add(&buf, host);
  if(result)
    goto out;
  if(port) {
    result = Curl_dyn_addf(&buf, ":%s", port);
    if(result)
      goto out;
  }
  req->authority = strdup(Curl_dyn_ptr(&buf));
  if(!req->authority)
    goto out;
  result = CURLE_OK;

out:
  free(user);
  free(pass);
  free(host);
  free(port);
  Curl_dyn_free(&buf);
  return result;
}